

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O2

int Abc_NtkReadLogFile(char *pFileName,Abc_Cex_t **ppCex,int *pnFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar6;
  Abc_Cex_t *pAVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  int iFrameCex;
  int local_428;
  int local_424;
  char Buffer [1000];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for reading \"%s\".\n",pFileName);
  }
  else {
    iVar3 = -1;
    fgets(Buffer,1000,__stream);
    iVar1 = bcmp(Buffer,"snl_UNSAT",9);
    if (iVar1 == 0) {
      local_424 = atoi(Buffer + 9);
      local_428 = -1;
      iVar1 = 1;
    }
    else {
      iVar1 = bcmp(Buffer,"snl_SAT",7);
      if (iVar1 == 0) {
        pcVar10 = strtok(Buffer + 7," \t\n");
        local_424 = atoi(pcVar10);
        strtok((char *)0x0," \t\n");
        pcVar10 = strtok((char *)0x0," \t\n");
        if (pcVar10 == (char *)0x0) {
          local_428 = -1;
          iVar1 = 0;
        }
        else {
          local_428 = atoi(pcVar10);
          pcVar10 = strtok((char *)0x0," \t\n");
          iVar1 = 0;
          if (pcVar10 != (char *)0x0) {
            iVar3 = atoi(pcVar10);
          }
        }
      }
      else {
        iVar2 = bcmp(Buffer,"snl_UNK",7);
        iVar1 = iVar3;
        local_428 = iVar3;
        if (iVar2 == 0) {
          local_424 = atoi(Buffer + 7);
        }
        else {
          puts("Unrecognized status.");
          local_424 = iVar3;
        }
      }
    }
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar6 = (int *)malloc(400);
    p->pArray = piVar6;
    while ((uVar4 = fgetc(__stream), uVar4 != 0xffffffff && (uVar4 != 10))) {
      if ((uVar4 & 0xfffffffe) == 0x30) {
        Vec_IntPush(p,uVar4 - 0x30);
      }
    }
    uVar4 = p->nSize;
    while (uVar5 = fgetc(__stream), uVar5 != 0xffffffff) {
      if ((uVar5 & 0xfffffffe) == 0x30) {
        Vec_IntPush(p,uVar5 - 0x30);
      }
    }
    fclose(__stream);
    uVar5 = p->nSize;
    if (iVar3 == -1) {
      iVar3 = local_424;
    }
    if ((long)(int)uVar5 == 0) {
      pAVar7 = Abc_CexAlloc(0,0,iVar3 + 1);
      pAVar7->iFrame = iVar3;
      pAVar7->iPo = local_428;
      if (ppCex != (Abc_Cex_t **)0x0) {
        *ppCex = pAVar7;
      }
      Vec_IntFree(p);
LAB_00294f8c:
      if (pnFrames == (int *)0x0) {
        return iVar1;
      }
      *pnFrames = local_424;
      return iVar1;
    }
    if ((int)uVar4 < 0) {
      pcVar10 = "Cannot read register number.";
    }
    else if (uVar5 == uVar4) {
      pcVar10 = "Cannot read counter example.";
    }
    else {
      iVar2 = iVar3 + 1;
      if ((int)(uVar5 - uVar4) % iVar2 == 0) {
        pAVar7 = Abc_CexAlloc(uVar4,(int)(uVar5 - uVar4) / iVar2,iVar2);
        pAVar7->iPo = local_428;
        pAVar7->iFrame = iVar3;
        if (uVar5 != pAVar7->nBits) {
          __assert_fail("Vec_IntSize(vNums) == pCex->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLog.c"
                        ,0xdb,"int Abc_NtkReadLogFile(char *, Abc_Cex_t **, int *)");
        }
        uVar9 = 0;
        uVar8 = 0;
        if (0 < (int)uVar5) {
          uVar8 = (ulong)uVar5;
        }
        for (; (long)uVar9 < (long)(int)uVar5; uVar9 = uVar9 + 1) {
          if (uVar8 == uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->pArray[uVar9] != 0) {
            (&pAVar7[1].iPo)[uVar9 >> 5 & 0x7ffffff] =
                 (&pAVar7[1].iPo)[uVar9 >> 5 & 0x7ffffff] | 1 << ((byte)uVar9 & 0x1f);
          }
        }
        Vec_IntFree(p);
        if (ppCex == (Abc_Cex_t **)0x0) {
          free(pAVar7);
        }
        else {
          *ppCex = pAVar7;
        }
        goto LAB_00294f8c;
      }
      pcVar10 = "Incorrect number of bits.";
    }
    puts(pcVar10);
    Vec_IntFree(p);
  }
  return -1;
}

Assistant:

int Abc_NtkReadLogFile( char * pFileName, Abc_Cex_t ** ppCex, int * pnFrames )
{
    FILE * pFile;
    Abc_Cex_t * pCex;
    Vec_Int_t * vNums;
    char Buffer[1000], * pToken, * RetValue;
    int c, nRegs = -1, nFrames = -1, iPo = -1, Status = -1, nFrames2 = -1;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for reading \"%s\".\n" , pFileName );
        return -1;
    }
    RetValue = fgets( Buffer, 1000, pFile );
    if ( !strncmp( Buffer, "snl_UNSAT", strlen("snl_UNSAT") ) )
    {
        Status = 1;
        nFrames = atoi( Buffer + strlen("snl_UNSAT") ); 
    }
    else if ( !strncmp( Buffer, "snl_SAT", strlen("snl_SAT") ) )
    {
        Status = 0;
//        nFrames = atoi( Buffer + strlen("snl_SAT") ); 
        pToken  = strtok( Buffer + strlen("snl_SAT"), " \t\n" );
        nFrames = atoi( pToken ); 
        pToken  = strtok( NULL, " \t\n" );
        pToken  = strtok( NULL, " \t\n" );
        if ( pToken != NULL )
        {
            iPo     = atoi( pToken ); 
            pToken  = strtok( NULL, " \t\n" );
            if ( pToken )
                nFrames2 = atoi( pToken ); 
        }
//        else
//            printf( "Warning! The current status is SAT but the current CEX is not given.\n"  );
    }
    else if ( !strncmp( Buffer, "snl_UNK", strlen("snl_UNK") ) )
    {
        Status = -1;
        nFrames = atoi( Buffer + strlen("snl_UNK") ); 
    }
    else
    {
        printf( "Unrecognized status.\n" );
    }
    // found regs till the new line
    vNums = Vec_IntAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' )
            break;
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    nRegs = Vec_IntSize(vNums);
    // skip till the new line
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    fclose( pFile );
    if ( Vec_IntSize(vNums) )
    {
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        if ( nRegs < 0 )
        {
            printf( "Cannot read register number.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( Vec_IntSize(vNums)-nRegs == 0 )
        {
            printf( "Cannot read counter example.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( (Vec_IntSize(vNums)-nRegs) % (iFrameCex + 1) != 0 )
        {
            printf( "Incorrect number of bits.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        pCex = Abc_CexAlloc( nRegs, (Vec_IntSize(vNums)-nRegs)/(iFrameCex + 1), iFrameCex + 1 );
        pCex->iPo    = iPo;
        pCex->iFrame = iFrameCex;
        assert( Vec_IntSize(vNums) == pCex->nBits );
        for ( c = 0; c < pCex->nBits; c++ )
            if ( Vec_IntEntry(vNums, c) )
                Abc_InfoSetBit( pCex->pData, c );
        Vec_IntFree( vNums );
        if ( ppCex )
            *ppCex = pCex;
        else
            ABC_FREE( pCex );
    }
    else
    {                                                         
        // corner case of seq circuit with no PIs             
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        pCex = Abc_CexAlloc( 0, 0, iFrameCex + 1 );           
        pCex->iFrame = iFrameCex;                             
        pCex->iPo    = iPo;                                   
        if ( ppCex )                                          
            *ppCex = pCex;                                    
        Vec_IntFree( vNums );                                 
    }                                                         
    if ( pnFrames )
        *pnFrames = nFrames;
    return Status;
}